

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

void * luaL_testudata(lua_State *L,int idx,char *tname)

{
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar1;
  TValue *pTVar2;
  size_t lenx;
  GCstr *key;
  cTValue *pcVar3;
  ulong uVar4;
  
  pTVar2 = index2adr(L,idx);
  aVar1 = pTVar2->field_4;
  if (aVar1.it >> 0xf == 0x1fff3) {
    uVar4 = *(ulong *)((L->glref).ptr64 + 0x110);
    lenx = strlen(tname);
    key = lj_str_new(L,tname,lenx);
    pcVar3 = lj_tab_getstr((GCtab *)(uVar4 & 0x7fffffffffff),key);
    if (((pcVar3 != (cTValue *)0x0) && ((pcVar3->u64 & 0xffff800000000000) == 0xfffa000000000000))
       && (uVar4 = (ulong)aVar1 & 0x7fffffffffff,
          (pcVar3->u64 & 0x7fffffffffff) == *(ulong *)(uVar4 + 0x20))) {
      return (void *)(uVar4 + 0x30);
    }
  }
  return (void *)0x0;
}

Assistant:

LUALIB_API void *luaL_testudata(lua_State *L, int idx, const char *tname)
{
  cTValue *o = index2adr(L, idx);
  if (tvisudata(o)) {
    GCudata *ud = udataV(o);
    cTValue *tv = lj_tab_getstr(tabV(registry(L)), lj_str_newz(L, tname));
    if (tv && tvistab(tv) && tabV(tv) == tabref(ud->metatable))
      return uddata(ud);
  }
  return NULL;  /* value is not a userdata with a metatable */
}